

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall QMultiHash<int,_int>::iterator::iterator(iterator *this,piter it,Chain **entry)

{
  bool bVar1;
  MultiNode<int,_int> *pMVar2;
  Data<QHashPrivate::MultiNode<int,_int>_> *in_RCX;
  size_t in_RDX;
  Data<QHashPrivate::MultiNode<int,_int>_> *in_RSI;
  iterator<QHashPrivate::MultiNode<int,_int>_> *in_RDI;
  long in_FS_OFFSET;
  iterator<QHashPrivate::MultiNode<int,_int>_> *this_00;
  iterator<QHashPrivate::MultiNode<int,_int>_> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->d = in_RSI;
  in_RDI->bucket = in_RDX;
  in_RDI[1].d = in_RCX;
  this_00 = in_RDI;
  bVar1 = QHashPrivate::iterator<QHashPrivate::MultiNode<int,_int>_>::atEnd(&local_18);
  if ((!bVar1) && (in_RDI[1].d == (Data<QHashPrivate::MultiNode<int,_int>_> *)0x0)) {
    pMVar2 = QHashPrivate::iterator<QHashPrivate::MultiNode<int,_int>_>::node(this_00);
    in_RDI[1].d = (Data<QHashPrivate::MultiNode<int,_int>_> *)&pMVar2->value;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit inline iterator(piter it, Chain **entry = nullptr) noexcept : i(it), e(entry)
        {
            if (!it.atEnd() && !e) {
                e = &it.node()->value;
                Q_ASSERT(e && *e);
            }
        }